

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<double>::
Generators<Catch::Generators::GeneratorWrapper<double>,double>
          (Generators<double> *this,GeneratorWrapper<double> *moreGenerators,
          double *moreGenerators_1)

{
  double *moreGenerators_local_1;
  GeneratorWrapper<double> *moreGenerators_local;
  Generators<double> *this_local;
  
  IGenerator<double>::IGenerator(&this->super_IGenerator<double>);
  (this->super_IGenerator<double>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase =
       (_func_int **)&PTR_next_007bdc18;
  std::
  vector<Catch::Generators::GeneratorWrapper<double>,_std::allocator<Catch::Generators::GeneratorWrapper<double>_>_>
  ::vector(&this->m_generators);
  this->m_current = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<double>,_std::allocator<Catch::Generators::GeneratorWrapper<double>_>_>
  ::reserve(&this->m_generators,2);
  add_generators<Catch::Generators::GeneratorWrapper<double>,double>
            (this,moreGenerators,moreGenerators_1);
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }